

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleInline.hpp
# Opt level: O2

ostream * operator<<(ostream *out,IMLE *imle_obj)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(out,"-----------------------  Parameters  ----");
  std::endl<char,std::char_traits<char>>(poVar1);
  IMLE::Param::display(&imle_obj->param,out);
  IMLE::modelDisplay(imle_obj,out);
  return out;
}

Assistant:

IMLE_CLASS_TEMPLATE
std::ostream &operator<<(std::ostream &out, IMLE_base const &imle_obj)
{
    out << "-----------------------  Parameters  ----" << std::endl;
    imle_obj.displayParameters(out);
    imle_obj.modelDisplay(out);

    return out;
}